

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O3

void __thiscall
wabt::interp::RefPtr<wabt::interp::Exception>::RefPtr
          (RefPtr<wabt::interp::Exception> *this,Store *store,Ref ref)

{
  Object *pOVar1;
  Exception *pEVar2;
  Index IVar3;
  Value *__s;
  interp *this_00;
  Value *pVVar4;
  Ref local_20;
  
  pOVar1 = (store->objects_).list_.
           super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
           _M_impl.super__Vector_impl_data._M_start[ref.index];
  if (((ulong)pOVar1 & 1) == 0) {
    this_00 = (interp *)(long)(int)pOVar1->kind_;
    if (this_00 != (interp *)0x3) {
      if (ref.index == 0) {
        this_00 = (interp *)0x0;
      }
      interp::RefPtr(this_00);
      if ((ulong)store >> 0x3b == 0) {
        *(undefined8 *)this_00 = 0;
        *(undefined8 *)((new_allocator<wabt::interp::Value> *)this_00 + 8) = 0;
        *(undefined8 *)((new_allocator<wabt::interp::Value> *)this_00 + 0x10) = 0;
        if (store == (Store *)0x0) {
          *(undefined8 *)this_00 = 0;
          *(undefined8 *)((new_allocator<wabt::interp::Value> *)this_00 + 8) = 0;
          *(undefined8 *)((new_allocator<wabt::interp::Value> *)this_00 + 0x10) = 0;
          pVVar4 = (Value *)0x0;
        }
        else {
          __s = __gnu_cxx::new_allocator<wabt::interp::Value>::allocate
                          ((new_allocator<wabt::interp::Value> *)this_00,(size_type)store,
                           (void *)0x0);
          *(Value **)this_00 = __s;
          pVVar4 = __s + (long)store;
          *(Value **)((new_allocator<wabt::interp::Value> *)this_00 + 0x10) = pVVar4;
          memset(__s,0,(long)store * 0x10);
        }
        *(Value **)((new_allocator<wabt::interp::Value> *)this_00 + 8) = pVVar4;
        return;
      }
      std::__throw_length_error("cannot create std::vector larger than max_size()");
    }
    local_20.index = ref.index;
    IVar3 = FreeList<wabt::interp::Ref>::New<wabt::interp::Ref&>(&store->roots_,&local_20);
    this->root_index_ = IVar3;
    pEVar2 = (Exception *)
             (store->objects_).list_.
             super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
             _M_impl.super__Vector_impl_data._M_start[ref.index];
    if (((ulong)pEVar2 & 1) == 0) {
      this->obj_ = pEVar2;
      this->store_ = store;
      return;
    }
  }
  else if (ref.index == 0) {
    interp::RefPtr((interp *)0x0);
  }
  __assert_fail("IsUsed(index)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/interp/interp-inl.h"
                ,0xe6,
                "T &wabt::interp::FreeList<wabt::interp::Object *>::Get(Index) [T = wabt::interp::Object *]"
               );
}

Assistant:

RefPtr<T>::RefPtr(Store& store, Ref ref) {
#ifndef NDEBUG
  if (!store.Is<T>(ref)) {
    ObjectKind ref_kind;
    if (ref == Ref::Null) {
      ref_kind = ObjectKind::Null;
    } else {
      ref_kind = store.objects_.Get(ref.index)->kind();
    }
    fprintf(stderr, "Invalid conversion from Ref (%s) to RefPtr<%s>!\n",
            GetName(ref_kind), T::GetTypeName());
    abort();
  }
#endif
  root_index_ = store.NewRoot(ref);
  obj_ = static_cast<T*>(store.objects_.Get(ref.index));
  store_ = &store;
}